

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

void Wln_RetMarkChanges_rec(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  piVar2 = Vec_IntEntryP(&p->vPathDelays,iObj);
  if (-1 < *piVar2) {
    *piVar2 = -1;
    for (lVar3 = 0; iVar1 = Vec_IntEntry(&p->pNtk->vRefs,iObj), lVar3 < iVar1; lVar3 = lVar3 + 1) {
      piVar2 = Wln_RetFanouts(p,iObj);
      iVar1 = piVar2[lVar3 * 2];
      piVar2 = Wln_RetFanouts(p,iObj);
      piVar2 = Vec_IntEntryP(&p->vFanins,piVar2[lVar3 * 2 + 1]);
      if (piVar2 == (int *)0x0) {
        return;
      }
      if ((iVar1 != 0) && (*piVar2 == 0)) {
        Wln_RetMarkChanges_rec(p,iVar1);
      }
    }
  }
  return;
}

Assistant:

void Wln_RetMarkChanges_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanout, * pLink, * pDelay = Vec_IntEntryP( &p->vPathDelays, iObj );
    if ( *pDelay < 0 )
        return;
    *pDelay = -1;
    Wln_RetForEachFanout( p, iObj, iFanout, pLink, k )
        if ( !pLink[0] )
            Wln_RetMarkChanges_rec( p, iFanout );
}